

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::SourceCodeInfo_Location::SourceCodeInfo_Location
          (SourceCodeInfo_Location *this,SourceCodeInfo_Location *from)

{
  void *pvVar1;
  uint uVar2;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__SourceCodeInfo_Location_0042c7d0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  RepeatedField<int>::RepeatedField(&this->path_,&from->path_);
  RepeatedField<int>::RepeatedField(&this->span_,&from->span_);
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField(&this->leading_detached_comments_,&from->leading_detached_comments_);
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  (this->leading_comments_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  uVar2 = (from->_has_bits_).has_bits_[0];
  if ((uVar2 & 1) != 0) {
    internal::ArenaStringPtr::AssignWithDefault
              (&this->leading_comments_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
               (from->leading_comments_).ptr_);
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  (this->trailing_comments_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar2 & 2) != 0) {
    internal::ArenaStringPtr::AssignWithDefault
              (&this->trailing_comments_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
               (from->trailing_comments_).ptr_);
  }
  return;
}

Assistant:

SourceCodeInfo_Location::SourceCodeInfo_Location(const SourceCodeInfo_Location& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0),
      path_(from.path_),
      span_(from.span_),
      leading_detached_comments_(from.leading_detached_comments_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  leading_comments_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_leading_comments()) {
    leading_comments_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.leading_comments_);
  }
  trailing_comments_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_trailing_comments()) {
    trailing_comments_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.trailing_comments_);
  }
  // @@protoc_insertion_point(copy_constructor:google.protobuf.SourceCodeInfo.Location)
}